

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llhttp.c
# Opt level: O2

llparse_match_t
llparse__match_sequence_id(llhttp__internal_t *s,uchar *p,uchar *endp,uchar *seq,uint32_t seq_len)

{
  uint uVar1;
  uchar uVar2;
  uchar uVar3;
  ulong uVar4;
  ulong in_RAX;
  uint uVar5;
  char cVar6;
  llparse_match_t lVar7;
  
  uVar5 = s->_index;
  do {
    if (p == endp) {
      in_RAX = 1;
      p = endp;
LAB_00106157:
      s->_index = uVar5;
LAB_00106159:
      lVar7.current = p;
      lVar7._0_8_ = in_RAX;
      return lVar7;
    }
    uVar1 = uVar5 + 1;
    uVar4 = 0;
    if (uVar1 != seq_len) {
      uVar4 = in_RAX & 0xffffffff;
    }
    in_RAX = uVar4;
    uVar2 = *p;
    uVar3 = seq[uVar5];
    if (uVar2 != uVar3) {
      in_RAX = 2;
    }
    cVar6 = (uVar1 == seq_len) * '\x05';
    if (uVar2 != uVar3) {
      cVar6 = '\x05';
    }
    if (cVar6 != '\0') {
      if (cVar6 != '\x05') goto LAB_00106159;
      uVar5 = 0;
      goto LAB_00106157;
    }
    if (uVar2 != uVar3) {
      uVar1 = uVar5;
    }
    uVar5 = uVar1;
    p = p + 1;
  } while( true );
}

Assistant:

static llparse_match_t llparse__match_sequence_id(
    llhttp__internal_t* s, const unsigned char* p,
    const unsigned char* endp,
    const unsigned char* seq, uint32_t seq_len) {
  uint32_t index;
  llparse_match_t res;

  index = s->_index;
  for (; p != endp; p++) {
    unsigned char current;

    current = *p;
    if (current == seq[index]) {
      if (++index == seq_len) {
        res.status = kMatchComplete;
        goto reset;
      }
    } else {
      res.status = kMatchMismatch;
      goto reset;
    }
  }
  s->_index = index;
  res.status = kMatchPause;
  res.current = p;
  return res;
reset:
  s->_index = 0;
  res.current = p;
  return res;
}